

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O0

int synchnet(curl_socket_t f)

{
  int iVar1;
  socklen_t local_22c;
  undefined1 local_228 [4];
  curl_socklen_t fromaddrlen;
  srvr_sockaddr_union_t fromaddr;
  char rbuf [516];
  int j;
  int i;
  curl_socket_t f_local;
  
  rbuf[0x1fc] = '\0';
  rbuf[0x1fd] = '\0';
  rbuf[0x1fe] = '\0';
  rbuf[0x1ff] = '\0';
  while( true ) {
    ioctl(f,0x541b,rbuf + 0x200);
    if (rbuf._512_4_ == 0) break;
    rbuf._508_4_ = rbuf._508_4_ + 1;
    local_22c = 0x10;
    recvfrom(f,fromaddr.sa.sa_data + 6,0x204,0,(sockaddr *)local_228,&local_22c);
  }
  iVar1._0_1_ = rbuf[0x1fc];
  iVar1._1_1_ = rbuf[0x1fd];
  iVar1._2_1_ = rbuf[0x1fe];
  iVar1._3_1_ = rbuf[0x1ff];
  return iVar1;
}

Assistant:

static int synchnet(curl_socket_t f /* socket to flush */)
{

#if defined(HAVE_IOCTLSOCKET)
  unsigned long i;
#else
  int i;
#endif
  int j = 0;
  char rbuf[PKTSIZE];
  srvr_sockaddr_union_t fromaddr;
  curl_socklen_t fromaddrlen;

  for (;;) {
#if defined(HAVE_IOCTLSOCKET)
    (void) ioctlsocket(f, FIONREAD, &i);
#else
    (void) ioctl(f, FIONREAD, &i);
#endif
    if (i) {
      j++;
#ifdef ENABLE_IPV6
      if(!use_ipv6)
#endif
        fromaddrlen = sizeof(fromaddr.sa4);
#ifdef ENABLE_IPV6
      else
        fromaddrlen = sizeof(fromaddr.sa6);
#endif
      (void) recvfrom(f, rbuf, sizeof(rbuf), 0,
                      &fromaddr.sa, &fromaddrlen);
    }
    else
      break;
  }
  return j;
}